

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# includeLoopRecognition.cpp
# Opt level: O0

string * realFilename(string *__return_storage_ptr__,string *file)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char local_21;
  int local_20;
  char c;
  int i;
  string *file_local;
  string *filename;
  
  c = '\0';
  _i = file;
  file_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = std::__cxx11::string::size();
  while( true ) {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)file);
    local_21 = *pcVar1;
    if (local_21 == '/') break;
    std::operator+(&local_58,local_21,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string realFilename(std::string file) {
    std::string filename;
    for (int i = file.size() - 1; i >= 0; --i) {
        char c = file[i];
        if (c == '/') {
            break;
        }
        filename = c + filename;
    }
    return filename;
}